

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cmd.c
# Opt level: O2

int cfg_cmd_handle_set(cfg_instance *instance,cfg_db *db,char *arg,autobuf *log)

{
  int iVar1;
  char *arg_00;
  cfg_entry *pcVar2;
  cfg_named_section *pcVar3;
  int iVar4;
  char *fmt;
  _Bool dummy;
  _parsed_argument pa;
  
  arg_00 = strdup(arg);
  if (arg_00 == (char *)0x0) {
    return -1;
  }
  iVar1 = _do_parse_arg(arg_00,&pa,log);
  iVar4 = -1;
  if (iVar1 != 0) goto LAB_00140a29;
  if (pa.entry_value == (char *)0x0) {
    if (pa.entry_key == (char *)0x0) {
      pcVar3 = _cfg_db_add_section(db,pa.section_type,pa.section_name,&dummy);
      if (pcVar3 != (cfg_named_section *)0x0) goto LAB_001409f9;
      fmt = "Cannot create section: \'%s\'\n";
    }
    else {
      fmt = "Key without value is not allowed for set command: %s";
    }
  }
  else {
    pcVar2 = cfg_db_set_entry_ext
                       (db,pa.section_type,pa.section_name,pa.entry_key,pa.entry_value,true,true);
    if (pcVar2 != (cfg_entry *)0x0) {
LAB_001409f9:
      iVar4 = 0;
      goto LAB_00140a29;
    }
    fmt = "Cannot create entry: \'%s\'\n";
    iVar4 = 0;
  }
  cfg_append_printable_line(log,fmt,arg);
LAB_00140a29:
  free(arg_00);
  return iVar4;
}

Assistant:

int
cfg_cmd_handle_set(
  struct cfg_instance *instance __attribute__((unused)), struct cfg_db *db, const char *arg, struct autobuf *log) {
  struct _parsed_argument pa;
  char *ptr;
  bool dummy;
  int result;

  /* get temporary copy of argument string */
  ptr = strdup(arg);
  if (!ptr)
    return -1;

  /* prepare for cleanup */
  result = -1;

  if (_do_parse_arg(ptr, &pa, log)) {
    goto handle_set_cleanup;
  }

  if (pa.entry_value != NULL) {
    if (cfg_db_set_entry(db, pa.section_type, pa.section_name, pa.entry_key, pa.entry_value, true)) {
      result = 0;
    }
    else {
      cfg_append_printable_line(log, "Cannot create entry: '%s'\n", arg);
    }
    result = 0;
    goto handle_set_cleanup;
  }

  if (pa.entry_key != NULL) {
    cfg_append_printable_line(log, "Key without value is not allowed for set command: %s", arg);
    goto handle_set_cleanup;
  }

  /* set section */
  if (NULL == _cfg_db_add_section(db, pa.section_type, pa.section_name, &dummy)) {
    cfg_append_printable_line(log, "Cannot create section: '%s'\n", arg);
    goto handle_set_cleanup;
  }
  result = 0;

handle_set_cleanup:
  free(ptr);
  return result;
}